

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O0

Command * __thiscall Commander::getCommand(Commander *this,string *line)

{
  bool bVar1;
  ostream *this_00;
  mapped_type *ppCVar2;
  Command *cmd;
  _Self local_60 [3];
  _Self local_48;
  undefined1 local_40 [8];
  string name;
  string *line_local;
  Commander *this_local;
  
  name.field_2._8_8_ = line;
  std::__cxx11::string::string((string *)local_40,(string *)line);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
       ::find(&this->cmds,(key_type *)local_40);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
       ::end(&this->cmds);
  bVar1 = std::operator==(&local_48,local_60);
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"No such command");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (Commander *)0x0;
  }
  else {
    ppCVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
              ::operator[](&this->cmds,(key_type *)local_40);
    this_local = (Commander *)*ppCVar2;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (Command *)this_local;
}

Assistant:

Command* Commander::getCommand(const std::string& line)
{
    std::string name = line;
    //TODO: split the line...
    if (cmds.find(name) == cmds.end() ) {
       std::cerr << "No such command" << endl;
       return NULL;
    }

    Command *cmd = this->cmds[name];
    return cmd;
}